

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsNotEqualDifferingNumberOfUnits_Test::
~Equality_unitsNotEqualDifferingNumberOfUnits_Test
          (Equality_unitsNotEqualDifferingNumberOfUnits_Test *this)

{
  Equality_unitsNotEqualDifferingNumberOfUnits_Test *this_local;
  
  ~Equality_unitsNotEqualDifferingNumberOfUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, unitsNotEqualDifferingNumberOfUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", 1.0, "second_id");
    u1->addUnit("metre", -1.0, "metre_id");
    u2->addUnit("second", 1.0, "second_id");

    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
}